

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_context_build(secp256k1_ecmult_context *ctx,void **prealloc)

{
  void *base_00;
  secp256k1_ge_storage_0_ *psVar1;
  size_t size_1;
  undefined1 local_130 [4];
  int i;
  secp256k1_gej g_128j;
  size_t size;
  size_t prealloc_size;
  void *base;
  secp256k1_gej gj;
  void **prealloc_local;
  secp256k1_ecmult_context *ctx_local;
  
  base_00 = *prealloc;
  if (ctx->pre_g == (secp256k1_ge_storage_0_ *)0x0) {
    gj._120_8_ = prealloc;
    secp256k1_gej_set_ge((secp256k1_gej *)&base,&secp256k1_ge_const_g);
    g_128j.infinity = 0x80000;
    g_128j._124_4_ = 0;
    psVar1 = (secp256k1_ge_storage_0_ *)manual_alloc((void **)gj._120_8_,0x80000,base_00,0x100000);
    ctx->pre_g = psVar1;
    secp256k1_ecmult_odd_multiples_table_storage_var
              (0x2000,(secp256k1_ge_storage *)ctx->pre_g,(secp256k1_gej *)&base);
    psVar1 = (secp256k1_ge_storage_0_ *)manual_alloc((void **)gj._120_8_,0x80000,base_00,0x100000);
    ctx->pre_g_128 = psVar1;
    memcpy(local_130,&base,0x80);
    for (size_1._4_4_ = 0; size_1._4_4_ < 0x80; size_1._4_4_ = size_1._4_4_ + 1) {
      secp256k1_gej_double_var
                ((secp256k1_gej *)local_130,(secp256k1_gej *)local_130,(secp256k1_fe *)0x0);
    }
    secp256k1_ecmult_odd_multiples_table_storage_var
              (0x2000,(secp256k1_ge_storage *)ctx->pre_g_128,(secp256k1_gej *)local_130);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_context_build(secp256k1_ecmult_context *ctx, void **prealloc) {
    secp256k1_gej gj;
    void* const base = *prealloc;
    size_t const prealloc_size = SECP256K1_ECMULT_CONTEXT_PREALLOCATED_SIZE;

    if (ctx->pre_g != NULL) {
        return;
    }

    /* get the generator */
    secp256k1_gej_set_ge(&gj, &secp256k1_ge_const_g);

    {
        size_t size = sizeof((*ctx->pre_g)[0]) * ((size_t)ECMULT_TABLE_SIZE(WINDOW_G));
        /* check for overflow */
        VERIFY_CHECK(size / sizeof((*ctx->pre_g)[0]) == ((size_t)ECMULT_TABLE_SIZE(WINDOW_G)));
        ctx->pre_g = (secp256k1_ge_storage (*)[])manual_alloc(prealloc, sizeof((*ctx->pre_g)[0]) * ECMULT_TABLE_SIZE(WINDOW_G), base, prealloc_size);
    }

    /* precompute the tables with odd multiples */
    secp256k1_ecmult_odd_multiples_table_storage_var(ECMULT_TABLE_SIZE(WINDOW_G), *ctx->pre_g, &gj);

    {
        secp256k1_gej g_128j;
        int i;

        size_t size = sizeof((*ctx->pre_g_128)[0]) * ((size_t) ECMULT_TABLE_SIZE(WINDOW_G));
        /* check for overflow */
        VERIFY_CHECK(size / sizeof((*ctx->pre_g_128)[0]) == ((size_t)ECMULT_TABLE_SIZE(WINDOW_G)));
        ctx->pre_g_128 = (secp256k1_ge_storage (*)[])manual_alloc(prealloc, sizeof((*ctx->pre_g_128)[0]) * ECMULT_TABLE_SIZE(WINDOW_G), base, prealloc_size);

        /* calculate 2^128*generator */
        g_128j = gj;
        for (i = 0; i < 128; i++) {
            secp256k1_gej_double_var(&g_128j, &g_128j, NULL);
        }
        secp256k1_ecmult_odd_multiples_table_storage_var(ECMULT_TABLE_SIZE(WINDOW_G), *ctx->pre_g_128, &g_128j);
    }
}